

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

SplitTuplePromise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> * __thiscall
kj::_::ForkHub<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>>::splitImpl<0ul,1ul>
          (ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Promise<void>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>
           *__return_storage_ptr__,undefined8 param_2,undefined8 param_3,
          Promise<kj::Own<capnp::PipelineHook>_> *param_4)

{
  Own<kj::_::PromiseNode> local_30;
  Own<kj::_::PromiseNode> local_20;
  
  addSplit<0ul>((ForkHub<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>> *)&local_20);
  addSplit<1ul>((ForkHub<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>> *)&local_30);
  tuple<kj::Promise<void>,kj::Promise<kj::Own<capnp::PipelineHook>>>
            (__return_storage_ptr__,(kj *)&local_20,(Promise<void> *)&local_30,param_4);
  Own<kj::_::PromiseNode>::dispose(&local_30);
  Own<kj::_::PromiseNode>::dispose(&local_20);
  return __return_storage_ptr__;
}

Assistant:

_::SplitTuplePromise<T> splitImpl(Indexes<indexes...>) {
    return kj::tuple(addSplit<indexes>()...);
  }